

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testProcrustes.cpp
# Opt level: O2

double procrustesError<float>(Vec3<float> *from,Vec3<float> *to,float *weights,size_t n,M44d *xform)

{
  float fVar1;
  undefined8 uVar2;
  long lVar3;
  size_t i;
  size_t sVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  Vec3<double> local_68;
  V3d xformed;
  
  dVar7 = 0.0;
  lVar3 = 2;
  dVar5 = 0.0;
  for (sVar4 = 0; n != sVar4; sVar4 = sVar4 + 1) {
    uVar2 = *(undefined8 *)((long)from + lVar3 * 4 + -8);
    local_68.x = (double)(float)uVar2;
    local_68.y = (double)(float)((ulong)uVar2 >> 0x20);
    local_68.z = (double)(&from->x)[lVar3];
    Imath_2_5::operator*(&local_68,xform);
    local_68.z = xformed.z - (double)(&to->x)[lVar3];
    uVar2 = *(undefined8 *)((long)to + lVar3 * 4 + -8);
    local_68.x = xformed.x - (double)(float)uVar2;
    local_68.y = xformed.y - (double)(float)((ulong)uVar2 >> 0x20);
    fVar1 = weights[sVar4];
    dVar6 = Imath_2_5::Vec3<double>::length2(&local_68);
    dVar7 = dVar6 * (double)fVar1 - dVar7;
    dVar6 = dVar5 + dVar7;
    dVar7 = (dVar6 - dVar5) - dVar7;
    lVar3 = lVar3 + 3;
    dVar5 = dVar6;
  }
  return dVar5;
}

Assistant:

double
procrustesError (const IMATH_INTERNAL_NAMESPACE::Vec3<T>* from,
                 const IMATH_INTERNAL_NAMESPACE::Vec3<T>* to,
                 const T* weights,
                 const size_t n,
                 const IMATH_INTERNAL_NAMESPACE::M44d& xform)
{
    double result = 0.0;
    double residual = 0.0;
    for (size_t i = 0; i < n; ++i)
    {
        IMATH_INTERNAL_NAMESPACE::V3d xformed = IMATH_INTERNAL_NAMESPACE::V3d(from[i]) * xform;
        IMATH_INTERNAL_NAMESPACE::V3d diff = xformed - IMATH_INTERNAL_NAMESPACE::V3d(to[i]);
        const double w = weights[i];
        const double mag = w * diff.length2();

        // Use Kahan summation for the heck of it:
        const double y = mag - residual;
        const double t = result + y;
        residual = (t - result) - y;
        result = t;
    }
    return result;
}